

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableCornerButton::QTableCornerButton(QTableCornerButton *this,QWidget *parent)

{
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)&(this->super_QAbstractButton).super_QWidget = &PTR_metaObject_007e91c0;
  *(undefined ***)&(this->super_QAbstractButton).super_QWidget.super_QPaintDevice =
       &PTR__QTableCornerButton_007e9388;
  return;
}

Assistant:

void paintEvent(QPaintEvent*) override {
        QStyleOptionHeader opt;
        opt.initFrom(this);
        QStyle::State state = QStyle::State_None;
        if (isEnabled())
            state |= QStyle::State_Enabled;
        if (isActiveWindow())
            state |= QStyle::State_Active;
        if (isDown())
            state |= QStyle::State_Sunken;
        opt.state = state;
        opt.rect = rect();
        opt.position = QStyleOptionHeader::OnlyOneSection;
        QPainter painter(this);
        style()->drawControl(QStyle::CE_Header, &opt, &painter, this);
    }